

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(IStream *in,int n,char *v)

{
  while( true ) {
    if (n < 0) {
      return;
    }
    (*in->_vptr_IStream[3])(in,v,1);
    if (*v == '\0') break;
    n = n + -1;
    v = v + 1;
  }
  return;
}

Assistant:

void
read (T &in, int n, char v[])		// zero-terminated string
{
    while (n >= 0)
    {
	S::readChars (in, v, 1);

	if (*v == 0)
	    break;

	--n;
	++v;
    }
}